

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O1

unsigned_long
cfgfile::format_t<unsigned_long,_cfgfile::qstring_trait_t>::from_string
          (parser_info_t<cfgfile::qstring_trait_t> *info,string_t *value)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  unsigned_long uVar6;
  logic_error *this;
  QStringView QVar7;
  bool ok;
  bool local_1b9;
  qstring_wrapper_t local_1b8;
  string local_1a0;
  string_t local_180;
  string_t local_168;
  string_t local_150;
  string_t local_138;
  string_t local_120;
  qstring_wrapper_t local_108;
  qstring_wrapper_t local_f0;
  qstring_wrapper_t local_d8;
  qstring_wrapper_t local_c0;
  qstring_wrapper_t local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_1b9 = false;
  pQVar1 = &((value->m_str).d.d)->super_QArrayData;
  pcVar2 = (value->m_str).d.ptr;
  qVar3 = (value->m_str).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar7.m_data = pcVar2;
  QVar7.m_size = qVar3;
  uVar6 = QString::toIntegral_helper(QVar7,&local_1b9,10);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  if (local_1b9 != false) {
    return uVar6;
  }
  this = (logic_error *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Invalid value: \"","");
  qstring_trait_t::from_ascii(&local_120,&local_50);
  operator+(&local_108,&local_120,value);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\". In file \"","");
  qstring_trait_t::from_ascii(&local_138,&local_70);
  operator+(&local_f0,&local_108,&local_138);
  operator+(&local_d8,&local_f0,&info->m_file_name);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\" on line ","");
  qstring_trait_t::from_ascii(&local_150,&local_90);
  operator+(&local_c0,&local_d8,&local_150);
  qstring_trait_t::to_string(&local_168,info->m_line_number);
  operator+(&local_a8,&local_c0,&local_168);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,".","");
  qstring_trait_t::from_ascii(&local_180,&local_1a0);
  operator+(&local_1b8,&local_a8,&local_180);
  std::logic_error::logic_error(this,"Please use desc() method of the exception.");
  *(undefined ***)this = &PTR__exception_t_00142d28;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  pcVar2 = *(char16_t **)(this + 0x18);
  uVar4 = local_1b8.m_str.d.d._0_4_;
  uVar5 = local_1b8.m_str.d.d._4_4_;
  local_1b8.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(this + 0x10) = uVar4;
  *(undefined4 *)(this + 0x14) = uVar5;
  *(undefined4 *)(this + 0x18) = local_1b8.m_str.d.ptr._0_4_;
  *(undefined4 *)(this + 0x1c) = local_1b8.m_str.d.ptr._4_4_;
  qVar3 = *(qsizetype *)(this + 0x20);
  *(qsizetype *)(this + 0x20) = local_1b8.m_str.d.size;
  local_1b8.m_str.d.ptr = pcVar2;
  local_1b8.m_str.d.size = qVar3;
  __cxa_throw(this,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

static unsigned long from_string( const parser_info_t< qstring_trait_t > & info,
		const qstring_trait_t::string_t & value )
	{
		bool ok = false;
		unsigned long result = ((QString)value).toULong( &ok );

		if( !ok )
			throw exception_t< qstring_trait_t >(
				qstring_trait_t::from_ascii( "Invalid value: \"" ) +
				value + qstring_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				qstring_trait_t::from_ascii( "\" on line " ) +
				qstring_trait_t::to_string( info.line_number() ) +
				qstring_trait_t::from_ascii( "." ) );
		else
			return result;
	}